

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeEditor.cxx
# Opt level: O0

int CodeEditor::auto_indent(int param_1,CodeEditor *e)

{
  int iVar1;
  int start_00;
  Fl_When FVar2;
  Fl_Text_Buffer *pFVar3;
  Fl_Text_Selection *this;
  char *__s;
  size_t sVar4;
  char *text_00;
  char *b;
  char *pcStack_30;
  int n;
  char *ptr;
  char *text;
  int start;
  int pos;
  CodeEditor *e_local;
  int param_0_local;
  
  pFVar3 = Fl_Text_Display::buffer((Fl_Text_Display *)e);
  iVar1 = Fl_Text_Buffer::selected(pFVar3);
  if (iVar1 != 0) {
    pFVar3 = Fl_Text_Display::buffer((Fl_Text_Display *)e);
    this = Fl_Text_Buffer::primary_selection(pFVar3);
    iVar1 = Fl_Text_Selection::start(this);
    Fl_Text_Display::insert_position((Fl_Text_Display *)e,iVar1);
    pFVar3 = Fl_Text_Display::buffer((Fl_Text_Display *)e);
    Fl_Text_Buffer::remove_selection(pFVar3);
  }
  iVar1 = Fl_Text_Display::insert_position((Fl_Text_Display *)e);
  start_00 = Fl_Text_Display::line_start((Fl_Text_Display *)e,iVar1);
  pFVar3 = Fl_Text_Display::buffer((Fl_Text_Display *)e);
  __s = Fl_Text_Buffer::text_range(pFVar3,start_00,iVar1);
  pcStack_30 = __s;
  while( true ) {
    iVar1 = isspace((int)*pcStack_30);
    if (iVar1 == 0) break;
    pcStack_30 = pcStack_30 + 1;
  }
  *pcStack_30 = '\0';
  if (*__s == '\0') {
    Fl_Text_Display::insert((Fl_Text_Display *)e,"\n");
  }
  else {
    sVar4 = strlen(__s);
    text_00 = (char *)malloc((long)((int)sVar4 + 2));
    *text_00 = '\n';
    strcpy(text_00 + 1,__s);
    Fl_Text_Display::insert((Fl_Text_Display *)e,text_00);
    free(text_00);
  }
  Fl_Text_Display::show_insert_position((Fl_Text_Display *)e);
  Fl_Widget::set_changed((Fl_Widget *)e);
  FVar2 = Fl_Widget::when((Fl_Widget *)e);
  if ((FVar2 & FL_WHEN_CHANGED) != FL_WHEN_NEVER) {
    Fl_Widget::do_callback((Fl_Widget *)e);
  }
  free(__s);
  return 1;
}

Assistant:

int CodeEditor::auto_indent(int, CodeEditor* e) {
  if (e->buffer()->selected()) {
    e->insert_position(e->buffer()->primary_selection()->start());
    e->buffer()->remove_selection();
  }

  int pos = e->insert_position();
  int start = e->line_start(pos);
  char *text = e->buffer()->text_range(start, pos);
  char *ptr;

  for (ptr = text; isspace(*ptr); ptr ++) {/*empty*/}
  *ptr = '\0';  
  if (*text) {
    // use only a single 'insert' call to avoid redraw issues
    int n = strlen(text);
    char *b = (char*)malloc(n+2);
    *b = '\n';
    strcpy(b+1, text);
    e->insert(b);
    free(b);
  } else {
    e->insert("\n");
  }
  e->show_insert_position();
  e->set_changed();
  if (e->when()&FL_WHEN_CHANGED) e->do_callback();

  free(text);

  return 1;
}